

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int graph_5_4::bfs_1(m_graph g)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int bfs_1(m_graph g) {
//        for (int i = 0; i < g.vnum; i++)
//            visited[i] = 0;
//        //InitQueue(Q);
//        for (int i = 0; i < g.vnum; i++) {
//            if (visited[i] == 0) {
//                visited[i] = 1;
//                //visit;
////                EnQueue(Q,i);
//                while (!isEmpty(Q)) {
//                    DnQueue(Q, i);
//                    for (int j = 0; j < g.vnum; j++) {
//                        if (visited[j] == 0 && g.arc[i][j] == 1) {
//                            visited[i]==1;
//                            visit;
//                            EnQueue(Q,i);
//                        }
//                    }
//                }
//            }
//        }
    }